

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  ulong uVar1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  char *__last;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  char_type buffer [26];
  char local_58 [40];
  
  bVar2 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  uVar4 = *(ulong *)this;
  __last = local_58 + *(int *)(this + 8);
  pcVar6 = __last;
  if (uVar4 < 100) {
    bVar13 = false;
  }
  else {
    iVar9 = -1;
    uVar11 = 1;
    iVar5 = -2;
    uVar12 = 2;
    uVar8 = uVar4;
    do {
      uVar4 = uVar8 / 100;
      uVar1 = (ulong)(uint)(((int)uVar8 + (int)uVar4 * -100) * 2);
      pcVar6[-1] = internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar3 = -1;
      if ((int)(uVar11 / 3) * 3 + iVar9 == 0) {
        *(num_writer *)(pcVar6 + -2) = this[0xc];
        lVar3 = -2;
      }
      pcVar6[lVar3 + -1] = internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar12 / 3) * 3 + iVar5 == 0) {
        *(num_writer *)(pcVar6 + lVar3 + -2) = this[0xc];
        lVar3 = lVar3 + -2;
      }
      else {
        lVar3 = lVar3 + -1;
      }
      pcVar6 = pcVar6 + lVar3;
      iVar9 = iVar9 + -2;
      uVar10 = (int)uVar11 + 2;
      uVar11 = (ulong)uVar10;
      iVar5 = iVar5 + -2;
      uVar12 = (ulong)((int)uVar12 + 2);
      bVar13 = 9999 < uVar8;
      uVar8 = uVar4;
    } while (bVar13);
    bVar13 = iVar9 + (uVar10 / 3) * 3 == 0;
  }
  if (uVar4 < 10) {
    bVar7 = (byte)uVar4 | 0x30;
  }
  else {
    pcVar6[-1] = internal::basic_data<void>::DIGITS[(uVar4 * 2 & 0xffffffff) + 1];
    lVar3 = -1;
    if (bVar13) {
      *(num_writer *)(pcVar6 + -2) = this[0xc];
      lVar3 = -2;
    }
    pcVar6 = pcVar6 + lVar3;
    bVar7 = internal::basic_data<void>::DIGITS[uVar4 * 2 & 0x1fffffffe];
  }
  pcVar6[-1] = bVar7;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (local_58,__last,bVar2);
  it->container = (list<char,_std::allocator<char>_> *)bVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }